

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O2

void Cmd_clearnodecache(FCommandLine *argv,APlayerPawn *who,int key)

{
  char *__filename;
  uint uVar1;
  FString path;
  TArray<FFileList,_FFileList> list;
  FString local_20;
  TArray<FFileList,_FFileList> local_18;
  
  local_18.Array = (FFileList *)0x0;
  local_18.Most = 0;
  local_18.Count = 0;
  M_GetCachePath(SUB81(&local_20,0));
  FString::operator+=(&local_20,"/");
  ScanDirectory(&local_18,local_20.Chars);
  uVar1 = local_18.Count;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)uVar1 < 0) break;
    __filename = local_18.Array[uVar1 & 0x7fffffff].Filename.Chars;
    if (local_18.Array[uVar1 & 0x7fffffff].isDirectory == true) {
      rmdir(__filename);
    }
    else {
      remove(__filename);
    }
  }
  FString::~FString(&local_20);
  TArray<FFileList,_FFileList>::~TArray(&local_18);
  return;
}

Assistant:

static int CheckForMissingSegs()
{
	double *added_seglen = new double[numsides];
	int missing = 0;

	memset(added_seglen, 0, sizeof(double)*numsides);
	for(int i=0;i<numsegs;i++)
	{
		seg_t * seg = &segs[i];

		if (seg->sidedef!=NULL)
		{
			// check all the segs and calculate the length they occupy on their sidedef
			DVector2 vec1(seg->v2->fX() - seg->v1->fX(), seg->v2->fY() - seg->v1->fY());
			added_seglen[seg->sidedef - sides] += vec1.Length();
		}
	}

	for(int i=0;i<numsides;i++)
	{
		double linelen = sides[i].linedef->Delta().Length();
		missing += (added_seglen[i] < linelen - 1.);
	}

	delete [] added_seglen;
	return missing;
}